

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  bool bVar2;
  time_t tVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  stKeyPressData<short> *k_2;
  ulong uVar7;
  uint uVar8;
  stKeyPressData<short> *k;
  _Alloc_hider _Var9;
  uint uVar10;
  ulong uVar11;
  stKeyPressData<short> *k_1;
  TKeyPressCollection keyPresses;
  TWaveform waveformInput;
  TSimilarityMap similarityMap;
  TWaveform waveformMax;
  TWaveform waveformThreshold;
  string local_d8;
  TWaveformT<short> local_b8;
  string local_98;
  ulong local_70;
  TWaveformT<short> local_68;
  TWaveformT<short> local_48;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  printf("Usage: %s record.kbd\n",*argv);
  iVar6 = -1;
  if (1 < argc) {
    local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    printf("[+] Loading recording from \'%s\'\n",argv[1]);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)&local_98);
    bVar2 = readFromFile<float,short>(&local_d8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                               local_d8.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (bVar2) {
      printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n",
             (ulong)((long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 1,2);
      printf("    Size in memory:          %g MB\n",
             SUB84((double)((float)(ulong)((long)local_b8.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_b8.
                                                super__Vector_base<short,_std::allocator<short>_>.
                                                _M_impl.super__Vector_impl_data._M_start) *
                            0.0009765625 * 0.0009765625),0));
      printf("    Sample size:             %d\n",2);
      printf("    Total number of samples: %d\n",
             (ulong)((long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 1);
      printf("    Recording length:        %g seconds\n",
             SUB84((double)((float)(ulong)((long)local_b8.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_b8.
                                                 super__Vector_base<short,_std::allocator<short>_>.
                                                 _M_impl.super__Vector_impl_data._M_start >> 1) /
                           24000.0),0));
      local_d8.field_2._M_allocated_capacity._0_4_ = 0;
      local_d8.field_2._M_allocated_capacity._4_4_ = 0;
      local_d8.field_2._8_4_ = 0;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length._0_4_ = 0;
      local_d8._M_string_length._4_4_ = 0;
      local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lVar4 = std::chrono::_V2::system_clock::now();
      puts("[+] Searching for key presses");
      local_98._M_string_length =
           (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start >> 1;
      local_98._M_dataplus._M_p =
           (pointer)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start;
      bVar2 = findKeyPresses<short>
                        ((TWaveformViewT<short> *)&local_98,(TKeyPressCollectionT<short> *)&local_d8
                         ,&local_48,&local_68,8.0,0x200,0x800,true);
      if (bVar2) {
        lVar5 = std::chrono::_V2::system_clock::now();
        printf("[+] Detected a total of %d potential key presses\n",
               (ulong)(uint)((int)((ulong)(CONCAT44(local_d8._M_string_length._4_4_,
                                                    (undefined4)local_d8._M_string_length) -
                                          (long)local_d8._M_dataplus._M_p) >> 4) * -0x55555555));
        pcVar1 = (pointer)CONCAT44(local_d8._M_string_length._4_4_,
                                   (undefined4)local_d8._M_string_length);
        for (_Var9._M_p = local_d8._M_dataplus._M_p; _Var9._M_p != pcVar1;
            _Var9._M_p = _Var9._M_p + 0x30) {
          printf("    position - %d\n",(ulong)*(uint *)(_Var9._M_p + 0x10));
        }
        printf("[+] Search took %4.3f seconds\n",
               SUB84((double)((float)((lVar5 - lVar4) / 1000000) / 1000.0),0));
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"key_presses.plot","");
        dumpKeyPresses<short>(&local_98,(TKeyPressCollectionT<short> *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 0;
      }
      else {
        puts("Failed to detect keypresses");
        iVar6 = -2;
      }
      if (bVar2) {
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        lVar4 = std::chrono::_V2::system_clock::now();
        puts("[+] Calculating CC similarity map");
        bVar2 = calculateSimilartyMap<short>
                          (0x100,0x100,0,(TKeyPressCollectionT<short> *)&local_d8,
                           (TSimilarityMap *)&local_98);
        if (bVar2) {
          lVar5 = std::chrono::_V2::system_clock::now();
          printf("[+] Calculation took %4.3f seconds\n",
                 SUB84((double)((float)((lVar5 - lVar4) / 1000000) / 1000.0),0));
          uVar10 = (int)(CONCAT44(local_d8._M_string_length._4_4_,
                                  (undefined4)local_d8._M_string_length) -
                         (long)local_d8._M_dataplus._M_p >> 4) * -0x55555555;
          if (0 < (int)uVar10) {
            lVar4 = 0x18;
            uVar7 = 0;
            do {
              printf("    Average CC for keypress %4d - %6.3f\n",
                     (int)*(undefined8 *)(local_d8._M_dataplus._M_p + lVar4),uVar7 & 0xffffffff);
              uVar7 = uVar7 + 1;
              lVar4 = lVar4 + 0x30;
            } while ((uVar10 & 0x7fffffff) != uVar7);
          }
          printf("%5d ",0xffffffff);
          if (0 < (int)uVar10) {
            uVar8 = 0;
            do {
              printf("%4d ",(ulong)uVar8);
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
          putchar(10);
          puts(
              "--------------------------------------------------------------------------------------------------------------------------------------"
              );
          if (0 < (int)uVar10) {
            local_70 = (ulong)(uVar10 & 0x7fffffff);
            uVar7 = 0;
            do {
              uVar11 = local_70;
              printf("%2d  | ",uVar7 & 0xffffffff);
              lVar4 = 0;
              do {
                if (*(double *)(*(long *)(local_98._M_dataplus._M_p + uVar7 * 0x18) + lVar4) <=
                    -0.45) {
                  printf("     ");
                }
                else {
                  printf("%4.0f ",SUB84(*(double *)
                                         (*(long *)(local_98._M_dataplus._M_p + uVar7 * 0x18) +
                                         lVar4) * 100.0,0));
                }
                lVar4 = lVar4 + 0x10;
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
              putchar(10);
              uVar7 = uVar7 + 1;
            } while (uVar7 != local_70);
          }
          putchar(10);
          clusterG((TSimilarityMap *)&local_98,(TKeyPressCollection *)&local_d8);
          pcVar1 = (pointer)CONCAT44(local_d8._M_string_length._4_4_,
                                     (undefined4)local_d8._M_string_length);
          for (_Var9._M_p = local_d8._M_dataplus._M_p; _Var9._M_p != pcVar1;
              _Var9._M_p = _Var9._M_p + 0x30) {
            printf("%d ",(ulong)*(uint *)(_Var9._M_p + 0x20));
          }
          putchar(10);
          pcVar1 = (pointer)CONCAT44(local_d8._M_string_length._4_4_,
                                     (undefined4)local_d8._M_string_length);
          for (_Var9._M_p = local_d8._M_dataplus._M_p; _Var9._M_p != pcVar1;
              _Var9._M_p = _Var9._M_p + 0x30) {
            putchar(*(int *)(_Var9._M_p + 0x20) + 0x60);
          }
          putchar(10);
          iVar6 = 0;
        }
        else {
          puts("Failed to calculate similariy map");
          iVar6 = -3;
        }
        std::
        vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
        ::~vector((vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   *)&local_98);
      }
      if (local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                 local_d8.field_2._M_allocated_capacity._0_4_) -
                        (long)local_d8._M_dataplus._M_p);
      }
    }
    else {
      printf("Specified file \'%s\' does not exist\n",argv[1]);
      iVar6 = -1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char ** argv) {
    srand(time(0));

    printf("Usage: %s record.kbd\n", argv[0]);
    if (argc < 2) {
        return -1;
    }

    int64_t sampleRate = 24000;

    TWaveform waveformInput;
    printf("[+] Loading recording from '%s'\n", argv[1]);
    if (readFromFile<TSampleF>(argv[1], waveformInput) == false) {
        printf("Specified file '%s' does not exist\n", argv[1]);
        return -1;
    }

    //{
    //    std::ofstream fout("waveform.plot");
    //    for (auto & a : waveformInput) {
    //        fout << a << std::endl;
    //    }
    //    fout.close();
    //}

    printf("[+] Loaded recording: of %d samples (sample size = %d bytes)\n", (int) waveformInput.size(), (int) sizeof(TSample));
    printf("    Size in memory:          %g MB\n", (float)(sizeof(TSample)*waveformInput.size())/1024/1024);
    printf("    Sample size:             %d\n", (int) sizeof(TSample));
    printf("    Total number of samples: %d\n", (int) waveformInput.size());
    printf("    Recording length:        %g seconds\n", (float)(waveformInput.size())/sampleRate);

    TKeyPressCollection keyPresses;
    TWaveform waveformThreshold;
    TWaveform waveformMax;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Searching for key presses\n");
        if (findKeyPresses(getView(waveformInput, 0), keyPresses, waveformThreshold, waveformMax, 8.0, 512, 2*1024, true) == false) {
            printf("Failed to detect keypresses\n");
            return -2;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Detected a total of %d potential key presses\n", (int) keyPresses.size());
        for (auto & k : keyPresses) {
            auto & pos = k.pos;

            printf("    position - %d\n", (int) pos);
        }
        printf("[+] Search took %4.3f seconds\n", toSeconds(tStart, tEnd));

        dumpKeyPresses("key_presses.plot", keyPresses);
    }

    //keyPresses.erase(keyPresses.begin(), keyPresses.begin() + keyPresses.size()/2);

    TSimilarityMap similarityMap;
    {
        auto tStart = std::chrono::high_resolution_clock::now();
        printf("[+] Calculating CC similarity map\n");
        if (calculateSimilartyMap(256, 256, 0, keyPresses, similarityMap) == false) {
            printf("Failed to calculate similariy map\n");
            return -3;
        }
        auto tEnd = std::chrono::high_resolution_clock::now();
        printf("[+] Calculation took %4.3f seconds\n", toSeconds(tStart, tEnd));
    }

    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & avgcc = keyPresses[i].ccAvg;

        printf("    Average CC for keypress %4d - %6.3f\n", i, avgcc);
    }

    printf("%5d ", -1);
    for (int j = 0; j < n; ++j) {
        printf("%4d ", j);
    }
    printf("\n");
    printf("--------------------------------------------------------------------------------------------------------------------------------------\n");

    for (int i = 0; i < n; ++i) {
        printf("%2d  | ", i);
        for (int j = 0; j < n; ++j) {
            auto cc     = similarityMap[i][j].cc;
            //auto offset = similarityMap[i][j].offset;

            if (cc > -0.45) {
                printf("%4.0f ", cc*100);
            } else {
                printf("     ");
            }
            //printf("%3d - %3d -> %4.3f, %3d\n", i, j, cc, (int) offset);
        }
        printf("\n");
    }

    printf("\n");

    //clusterDBSCAN(similarityMap, 0.8, 1, keyPresses);
    //clusterSimple(similarityMap, 0.50, keyPresses);
    clusterG(similarityMap, keyPresses);

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        //printf("%c", 'a' + cid - 1);
        printf("%d ", cid);
    }
    printf("\n");

    for (const auto & k : keyPresses) {
        auto & cid = k.cid;

        printf("%c", 'a' + cid - 1);
    }
    printf("\n");

    return 0;
}